

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsystemtraytracker.cpp
# Opt level: O0

QXcbSystemTrayTracker * QXcbSystemTrayTracker::create(QXcbConnection *connection)

{
  xcb_atom_t xVar1;
  int iVar2;
  QXcbSystemTrayTracker *in_RDI;
  long in_FS_OFFSET;
  xcb_atom_t selection;
  xcb_atom_t trayAtom;
  QByteArray netSysTray;
  undefined4 in_stack_ffffffffffffff28;
  Atom in_stack_ffffffffffffff2c;
  QXcbBasicConnection *in_stack_ffffffffffffff30;
  QByteArray *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  QXcbConnection *local_a0;
  undefined1 local_98 [24];
  QArrayDataPointer<char> local_80 [4];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  xVar1 = QXcbBasicConnection::atom(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if (xVar1 == 0) {
    local_a0 = (QXcbConnection *)0x0;
  }
  else {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char>::QArrayDataPointer(local_80,(Data *)0x0,"_NET_SYSTEM_TRAY_S",0x12);
    QByteArray::QByteArray
              ((QByteArray *)in_stack_ffffffffffffff30,
               (DataPointer *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar2 = QXcbBasicConnection::primaryScreenNumber((QXcbBasicConnection *)in_RDI);
    QByteArray::number((int)local_98,iVar2);
    ::operator+(in_stack_ffffffffffffff38,(QByteArray *)in_stack_ffffffffffffff30);
    ::QStringBuilder::operator_cast_to_QByteArray
              ((QStringBuilder<QByteArray,_QByteArray> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
              ((QStringBuilder<QByteArray,_QByteArray> *)in_stack_ffffffffffffff30);
    QByteArray::~QByteArray((QByteArray *)0x1df1bd);
    QByteArray::~QByteArray((QByteArray *)0x1df1c7);
    QArrayDataPointer<char>::~QArrayDataPointer
              ((QArrayDataPointer<char> *)in_stack_ffffffffffffff30);
    QByteArray::constData((QByteArray *)0x1df1e8);
    xVar1 = QXcbBasicConnection::internAtom
                      ((QXcbBasicConnection *)CONCAT44(xVar1,in_stack_ffffffffffffff50),
                       (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (xVar1 == 0) {
      local_a0 = (QXcbConnection *)0x0;
    }
    else {
      local_a0 = (QXcbConnection *)operator_new(0x30);
      QXcbSystemTrayTracker
                (in_RDI,local_a0,(xcb_atom_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (xcb_atom_t)in_stack_ffffffffffffff30);
    }
    QByteArray::~QByteArray((QByteArray *)0x1df256);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QXcbSystemTrayTracker *)local_a0;
  }
  __stack_chk_fail();
}

Assistant:

QXcbSystemTrayTracker *QXcbSystemTrayTracker::create(QXcbConnection *connection)
{
    // Selection, tray atoms for GNOME, NET WM Specification
    const xcb_atom_t trayAtom = connection->atom(QXcbAtom::Atom_NET_SYSTEM_TRAY_OPCODE);
    if (!trayAtom)
        return nullptr;
    const QByteArray netSysTray = QByteArrayLiteral("_NET_SYSTEM_TRAY_S") + QByteArray::number(connection->primaryScreenNumber());
    const xcb_atom_t selection = connection->internAtom(netSysTray.constData());
    if (!selection)
        return nullptr;

    return new QXcbSystemTrayTracker(connection, trayAtom, selection);
}